

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_optimizer.cpp
# Opt level: O0

glslopt_shader *
glslopt_optimize(glslopt_ctx *ctx,glslopt_shader_type type,char *shaderSource,uint options)

{
  bool bVar1;
  int iVar2;
  glslopt_shader *this;
  char *pcVar3;
  _mesa_glsl_parse_state *this_00;
  gl_linked_shader *pgStack_58;
  bool linked;
  gl_linked_shader *linked_shader;
  exec_list *ir;
  _mesa_glsl_parse_state *state;
  PrintGlslMode printMode;
  glslopt_shader *shader;
  char *pcStack_28;
  uint options_local;
  char *shaderSource_local;
  glslopt_ctx *pgStack_18;
  glslopt_shader_type type_local;
  glslopt_ctx *ctx_local;
  
  pcStack_28 = shaderSource;
  shaderSource_local._4_4_ = type;
  pgStack_18 = ctx;
  this = (glslopt_shader *)glslopt_shader::operator_new(0xa050,ctx->mem_ctx);
  glslopt_shader::glslopt_shader(this);
  state._4_4_ = kPrintGlslVertex;
  if (shaderSource_local._4_4_ == kGlslOptShaderVertex) {
    this->shader->Type = 0x8b31;
    this->shader->Stage = MESA_SHADER_VERTEX;
    state._4_4_ = kPrintGlslVertex;
  }
  else if (shaderSource_local._4_4_ == kGlslOptShaderFragment) {
    this->shader->Type = 0x8b30;
    this->shader->Stage = MESA_SHADER_FRAGMENT;
    state._4_4_ = kPrintGlslFragment;
  }
  if (this->shader->Type == 0) {
    pcVar3 = ralloc_asprintf(this,"Unknown shader type %d",(ulong)shaderSource_local._4_4_);
    this->infoLog = pcVar3;
    this->status = false;
  }
  else {
    this_00 = (_mesa_glsl_parse_state *)_mesa_glsl_parse_state::operator_new(0x588,this);
    _mesa_glsl_parse_state::_mesa_glsl_parse_state
              (this_00,&pgStack_18->mesa_ctx,this->shader->Stage,this);
    this_00->error = false;
    if ((options & 1) == 0) {
      iVar2 = glcpp_preprocess(this_00,&stack0xffffffffffffffd8,&this_00->info_log,
                               add_builtin_defines,this_00,&pgStack_18->mesa_ctx);
      this_00->error = iVar2 != 0;
      if ((this_00->error & 1U) != 0) {
        this->status = (bool)((this_00->error ^ 0xffU) & 1);
        this->infoLog = this_00->info_log;
        return this;
      }
    }
    _mesa_glsl_lexer_ctor(this_00,pcStack_28);
    _mesa_glsl_parse(this_00);
    _mesa_glsl_lexer_dtor(this_00);
    linked_shader = (gl_linked_shader *)exec_list::operator_new(0x20,this);
    exec_list::exec_list((exec_list *)linked_shader);
    this->shader->ir = (exec_list *)linked_shader;
    if (((this_00->error & 1U) == 0) &&
       (bVar1 = exec_list::is_empty(&this_00->translation_unit), !bVar1)) {
      _mesa_ast_to_hir((exec_list *)linked_shader,this_00);
    }
    if ((this_00->error & 1U) == 0) {
      validate_ir_tree((exec_list *)linked_shader);
      pcVar3 = ralloc_strdup(this,"");
      pcVar3 = _mesa_print_ir_glsl((exec_list *)linked_shader,this_00,pcVar3,state._4_4_);
      this->rawOutput = pcVar3;
    }
    lower_builtins((exec_list *)linked_shader);
    this->shader->symbols = this_00->symbols;
    pgStack_58 = (gl_linked_shader *)0x0;
    if ((((this_00->error & 1U) == 0) &&
        (bVar1 = exec_list::is_empty((exec_list *)linked_shader), !bVar1)) && ((options & 2) == 0))
    {
      pgStack_58 = link_intrastage_shaders
                             (this,&pgStack_18->mesa_ctx,this->whole_program,
                              this->whole_program->Shaders,this->whole_program->NumShaders,true);
      if (pgStack_58 == (gl_linked_shader *)0x0) {
        this->status = false;
        this->infoLog = this->whole_program->data->InfoLog;
        return this;
      }
      linked_shader = (gl_linked_shader *)pgStack_58->ir;
      debug_print_ir("==== After link ====",(exec_list *)linked_shader,this_00,this);
    }
    if (((this_00->error & 1U) == 0) &&
       (bVar1 = exec_list::is_empty((exec_list *)linked_shader), !bVar1)) {
      do_optimization_passes
                ((exec_list *)linked_shader,(bool)(((options & 2) != 0 ^ 0xffU) & 1),this_00,this);
      validate_ir_tree((exec_list *)linked_shader);
    }
    if ((this_00->error & 1U) == 0) {
      pcVar3 = ralloc_strdup(this,"");
      pcVar3 = _mesa_print_ir_glsl((exec_list *)linked_shader,this_00,pcVar3,state._4_4_);
      this->optimizedOutput = pcVar3;
    }
    this->status = (bool)((this_00->error ^ 0xffU) & 1);
    this->infoLog = this_00->info_log;
    find_shader_variables(this,(exec_list *)linked_shader);
    ralloc_free(linked_shader);
    ralloc_free(this_00);
    if (pgStack_58 != (gl_linked_shader *)0x0) {
      ralloc_free(pgStack_58);
    }
  }
  return this;
}

Assistant:

glslopt_shader* glslopt_optimize (glslopt_ctx* ctx, glslopt_shader_type type, const char* shaderSource, unsigned options)
{
	glslopt_shader* shader = new (ctx->mem_ctx) glslopt_shader ();

	PrintGlslMode printMode = kPrintGlslVertex;
	switch (type) {
	case kGlslOptShaderVertex:
			shader->shader->Type = GL_VERTEX_SHADER;
			shader->shader->Stage = MESA_SHADER_VERTEX;
			printMode = kPrintGlslVertex;
			break;
	case kGlslOptShaderFragment:
			shader->shader->Type = GL_FRAGMENT_SHADER;
			shader->shader->Stage = MESA_SHADER_FRAGMENT;
			printMode = kPrintGlslFragment;
			break;
	}
	if (!shader->shader->Type)
	{
		shader->infoLog = ralloc_asprintf (shader, "Unknown shader type %d", (int)type);
		shader->status = false;
		return shader;
	}

	_mesa_glsl_parse_state* state = new (shader) _mesa_glsl_parse_state (&ctx->mesa_ctx, shader->shader->Stage, shader);
	state->error = 0;

	if (!(options & kGlslOptionSkipPreprocessor))
	{
		state->error = !!glcpp_preprocess (state, &shaderSource, &state->info_log, add_builtin_defines, state, &ctx->mesa_ctx);
		if (state->error)
		{
			shader->status = !state->error;
			shader->infoLog = state->info_log;
			return shader;
		}
	}

	_mesa_glsl_lexer_ctor (state, shaderSource);
	_mesa_glsl_parse (state);
	_mesa_glsl_lexer_dtor (state);

	exec_list* ir = new (shader) exec_list();
	shader->shader->ir = ir;

	if (!state->error && !state->translation_unit.is_empty())
		_mesa_ast_to_hir (ir, state);

	// Un-optimized output
	if (!state->error) {
		validate_ir_tree(ir);
		shader->rawOutput = _mesa_print_ir_glsl(ir, state, ralloc_strdup(shader, ""), printMode);
	}

	// Lower builtin functions prior to linking.
	lower_builtins(ir);

	// Link built-in functions
	shader->shader->symbols = state->symbols;
	
	struct gl_linked_shader* linked_shader = NULL;

	if (!state->error && !ir->is_empty() && !(options & kGlslOptionNotFullShader))
	{
		linked_shader = link_intrastage_shaders(shader,
												&ctx->mesa_ctx,
												shader->whole_program,
												shader->whole_program->Shaders,
												shader->whole_program->NumShaders,
												true);
		if (!linked_shader)
		{
			shader->status = false;
			shader->infoLog = shader->whole_program->data->InfoLog;
			return shader;
		}
		ir = linked_shader->ir;
		
		debug_print_ir ("==== After link ====", ir, state, shader);
	}

	// Do optimization post-link
	if (!state->error && !ir->is_empty())
	{		
		const bool linked = !(options & kGlslOptionNotFullShader);
		do_optimization_passes(ir, linked, state, shader);
		validate_ir_tree(ir);
	}	
	
	// Final optimized output
	if (!state->error)
	{
		shader->optimizedOutput = _mesa_print_ir_glsl(ir, state, ralloc_strdup(shader, ""), printMode);
	}

	shader->status = !state->error;
	shader->infoLog = state->info_log;

	find_shader_variables (shader, ir);
	// FIXME: stats
	// if (!state->error)
	// 	calculate_shader_stats (ir, &shader->statsMath, &shader->statsTex, &shader->statsFlow);

	ralloc_free (ir);
	ralloc_free (state);

	if (linked_shader)
		ralloc_free(linked_shader);

	return shader;
}